

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderDerivateTests::init(ShaderDerivateTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  DataType DVar2;
  int iVar3;
  TestNode *pTVar4;
  TestNode *node;
  size_t sVar5;
  LinearDerivateCase *pLVar6;
  TestNode *pTVar7;
  TextureDerivateCase *this_00;
  char *description;
  char *pcVar8;
  uint uVar9;
  Precision PVar10;
  DerivateFunc DVar11;
  long lVar12;
  bool bVar13;
  TestNode *local_218;
  ulong local_210;
  DerivateFunc local_204;
  TestNode *local_200;
  TestNode *local_1f8;
  long *local_1f0;
  long local_1e0 [2];
  TestNode *local_1d0;
  TestNode *local_1c8;
  TestNode *local_1c0;
  long local_1b8;
  long local_1b0;
  ostringstream caseName;
  ios_base local_138 [264];
  
  DVar11 = DERIVATE_DFDX;
  local_218 = (TestNode *)this;
  do {
    pTVar4 = (TestNode *)operator_new(0x70);
    if (DVar11 < DERIVATE_LAST) {
      pcVar8 = (char *)((long)&DAT_00b42190 + (long)(int)(&DAT_00b42190)[DVar11]);
    }
    else {
      pcVar8 = (char *)0x0;
    }
    if (DVar11 < DERIVATE_LAST) {
      description = (&PTR_anon_var_dwarf_190d15_00d36468)[DVar11];
    }
    else {
      description = (char *)0x0;
    }
    local_204 = DVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,local_218->m_testCtx,pcVar8,description);
    pTVar7 = local_218;
    tcu::TestNode::addChild(local_218,pTVar4);
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,pTVar7->m_testCtx,"constant","Derivate of constant argument");
    local_1c8 = pTVar4;
    tcu::TestNode::addChild(pTVar4,node);
    uVar9 = 1;
    do {
      DVar2 = TYPE_FLOAT;
      if (1 < uVar9) {
        DVar2 = glu::getDataTypeFloatVec(uVar9);
      }
      pTVar4 = (TestNode *)operator_new(0xf8);
      pCVar1 = (Context *)local_218[1]._vptr_TestNode;
      pcVar8 = glu::getDataTypeName(DVar2);
      ConstantDerivateCase::ConstantDerivateCase
                ((ConstantDerivateCase *)pTVar4,pCVar1,pcVar8,"",local_204,DVar2);
      tcu::TestNode::addChild(node,pTVar4);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 5);
    lVar12 = 0;
    do {
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,local_218->m_testCtx,
                 init::s_linearDerivateCases[lVar12].name,
                 init::s_linearDerivateCases[lVar12].description);
      local_1f8 = (TestNode *)init::s_linearDerivateCases[lVar12].source;
      local_200 = pTVar4;
      tcu::TestNode::addChild(local_1c8,pTVar4);
      local_210 = CONCAT44(local_210._4_4_,1);
      do {
        PVar10 = PRECISION_LOWP;
        do {
          DVar2 = TYPE_FLOAT;
          if (1 < (uint)local_210) {
            DVar2 = glu::getDataTypeFloatVec((uint)local_210);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (lVar12 == 0 || PVar10 != PRECISION_LOWP) {
            pcVar8 = glu::getDataTypeName(DVar2);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
            }
            else {
              sVar5 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar8,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
            pcVar8 = glu::getPrecisionName(PVar10);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
            }
            else {
              sVar5 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar8,sVar5);
            }
            pLVar6 = (LinearDerivateCase *)operator_new(0x118);
            pCVar1 = (Context *)local_218[1]._vptr_TestNode;
            std::__cxx11::stringbuf::str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar6,pCVar1,(char *)local_1f0,"",local_204,DVar2,PVar10,0x1100,
                       SURFACETYPE_DEFAULT_FRAMEBUFFER,0,(char *)local_1f8);
            tcu::TestNode::addChild(local_200,(TestNode *)pLVar6);
            if (local_1f0 != local_1e0) {
              operator_delete(local_1f0,local_1e0[0] + 1);
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          std::ios_base::~ios_base(local_138);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        iVar3 = (uint)local_210 + 1;
        local_210 = CONCAT44(local_210._4_4_,iVar3);
      } while (iVar3 != 5);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
    pTVar4 = (TestNode *)0x0;
    do {
      pTVar7 = (TestNode *)operator_new(0x70);
      local_1d0 = pTVar4;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,local_218->m_testCtx,init::s_fboConfigs[(long)pTVar4].name,
                 "Derivate usage when rendering into FBO");
      local_210 = (ulong)init::s_fboConfigs[(long)pTVar4].surfaceType;
      local_1f8 = (TestNode *)(ulong)(uint)init::s_fboConfigs[(long)pTVar4].numSamples;
      local_200 = pTVar7;
      tcu::TestNode::addChild(local_1c8,pTVar7);
      uVar9 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          DVar2 = TYPE_FLOAT;
          if (1 < uVar9) {
            DVar2 = glu::getDataTypeFloatVec(uVar9);
          }
          bVar13 = (uint)local_210 == 2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (bVar13 || PVar10 != PRECISION_LOWP) {
            pcVar8 = glu::getDataTypeName(DVar2);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
            }
            else {
              sVar5 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar8,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
            pcVar8 = glu::getPrecisionName(PVar10);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
            }
            else {
              sVar5 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar8,sVar5);
            }
            pLVar6 = (LinearDerivateCase *)operator_new(0x118);
            pCVar1 = (Context *)local_218[1]._vptr_TestNode;
            std::__cxx11::stringbuf::str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar6,pCVar1,(char *)local_1f0,"",local_204,DVar2,PVar10,0x1100,
                       (SurfaceType)local_210,(int)local_1f8,
                       "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                      );
            tcu::TestNode::addChild(local_200,(TestNode *)pLVar6);
            if (local_1f0 != local_1e0) {
              operator_delete(local_1f0,local_1e0[0] + 1);
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          std::ios_base::~ios_base(local_138);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 5);
      pTVar4 = (TestNode *)((long)&local_1d0->_vptr_TestNode + 1);
    } while (pTVar4 != (TestNode *)0x4);
    lVar12 = 0;
    do {
      pTVar4 = (TestNode *)operator_new(0x70);
      local_1b0 = lVar12;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,local_218->m_testCtx,init::s_hints[lVar12].name,
                 "Shader derivate hints");
      local_1d0 = (TestNode *)(ulong)init::s_hints[lVar12].hint;
      tcu::TestNode::addChild(local_1c8,pTVar4);
      lVar12 = 0;
      local_1c0 = pTVar4;
      do {
        pTVar4 = local_1c0;
        pTVar7 = (TestNode *)operator_new(0x70);
        local_1b8 = lVar12;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar7,local_218->m_testCtx,init::s_hintFboConfigs[lVar12].name,
                   "");
        local_210 = (ulong)init::s_hintFboConfigs[lVar12].surfaceType;
        local_200 = (TestNode *)(ulong)(uint)init::s_hintFboConfigs[lVar12].numSamples;
        local_1f8 = pTVar7;
        tcu::TestNode::addChild(pTVar4,pTVar7);
        uVar9 = 1;
        do {
          PVar10 = PRECISION_LOWP;
          do {
            DVar2 = TYPE_FLOAT;
            if (1 < uVar9) {
              DVar2 = glu::getDataTypeFloatVec(uVar9);
            }
            bVar13 = (uint)local_210 == 2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
            if (bVar13 || PVar10 != PRECISION_LOWP) {
              pcVar8 = glu::getDataTypeName(DVar2);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
              }
              else {
                sVar5 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&caseName,pcVar8,sVar5);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
              pcVar8 = glu::getPrecisionName(PVar10);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
              }
              else {
                sVar5 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&caseName,pcVar8,sVar5);
              }
              pLVar6 = (LinearDerivateCase *)operator_new(0x118);
              pCVar1 = (Context *)local_218[1]._vptr_TestNode;
              std::__cxx11::stringbuf::str();
              LinearDerivateCase::LinearDerivateCase
                        (pLVar6,pCVar1,(char *)local_1f0,"",local_204,DVar2,PVar10,
                         (deUint32)local_1d0,(SurfaceType)local_210,(int)local_200,
                         "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                        );
              tcu::TestNode::addChild(local_1f8,(TestNode *)pLVar6);
              if (local_1f0 != local_1e0) {
                operator_delete(local_1f0,local_1e0[0] + 1);
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
            std::ios_base::~ios_base(local_138);
            PVar10 = PVar10 + PRECISION_MEDIUMP;
          } while (PVar10 != PRECISION_LAST);
          uVar9 = uVar9 + 1;
        } while (uVar9 != 5);
        lVar12 = local_1b8 + 1;
      } while (lVar12 != 3);
      lVar12 = local_1b0 + 1;
    } while (local_1b0 == 0);
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,local_218->m_testCtx,"texture",
               "Derivate of texture lookup result");
    tcu::TestNode::addChild(local_1c8,pTVar4);
    lVar12 = 0;
    local_1c0 = pTVar4;
    do {
      pTVar4 = local_1c0;
      pTVar7 = (TestNode *)operator_new(0x70);
      local_1b8 = lVar12;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,local_218->m_testCtx,init::s_textureConfigs[lVar12].name,""
                );
      local_210 = (ulong)init::s_textureConfigs[lVar12].surfaceType;
      local_1f8 = (TestNode *)(ulong)(uint)init::s_textureConfigs[lVar12].numSamples;
      local_200 = (TestNode *)(ulong)init::s_textureConfigs[lVar12].hint;
      local_1d0 = pTVar7;
      tcu::TestNode::addChild(pTVar4,pTVar7);
      uVar9 = 1;
      do {
        PVar10 = PRECISION_LOWP;
        do {
          DVar2 = TYPE_FLOAT;
          if (1 < uVar9) {
            DVar2 = glu::getDataTypeFloatVec(uVar9);
          }
          bVar13 = (uint)local_210 == 2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (bVar13 || PVar10 != PRECISION_LOWP) {
            pcVar8 = glu::getDataTypeName(DVar2);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
            }
            else {
              sVar5 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar8,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
            pcVar8 = glu::getPrecisionName(PVar10);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)&local_218 + (int)*(undefined8 *)(_caseName + -0x18) + 0x70);
            }
            else {
              sVar5 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar8,sVar5);
            }
            this_00 = (TextureDerivateCase *)operator_new(0x120);
            pCVar1 = (Context *)local_218[1]._vptr_TestNode;
            std::__cxx11::stringbuf::str();
            TextureDerivateCase::TextureDerivateCase
                      (this_00,pCVar1,(char *)local_1f0,"",local_204,DVar2,PVar10,
                       (deUint32)local_200,(SurfaceType)local_210,(int)local_1f8);
            tcu::TestNode::addChild(local_1d0,(TestNode *)this_00);
            if (local_1f0 != local_1e0) {
              operator_delete(local_1f0,local_1e0[0] + 1);
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          iVar3 = std::ios_base::~ios_base(local_138);
          PVar10 = PVar10 + PRECISION_MEDIUMP;
        } while (PVar10 != PRECISION_LAST);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 5);
      lVar12 = local_1b8 + 1;
    } while (lVar12 != 4);
    DVar11 = local_204 + DERIVATE_DFDY;
  } while (DVar11 != DERIVATE_LAST);
  return iVar3;
}

Assistant:

void ShaderDerivateTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		description;
		const char*		source;
	} s_linearDerivateCases[] =
	{
		{
			"linear",
			"Basic derivate of linearly interpolated argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"in_function",
			"Derivate of linear function argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"\n"
			"${PRECISION} ${DATATYPE} computeRes (${PRECISION} ${DATATYPE} value)\n"
			"{\n"
			"	return ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"}\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = computeRes(v_coord);\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_if",
			"Derivate of linearly interpolated value in static if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (false)\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_loop",
			"Derivate of linearly interpolated value in static loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < 2; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_switch",
			"Derivate of linearly interpolated value in static switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (1)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_if",
			"Derivate of linearly interpolated value in uniform if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform bool ub_true;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (ub_true)"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_loop",
			"Derivate of linearly interpolated value in uniform loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_two;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < ui_two; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_switch",
			"Derivate of linearly interpolated value in uniform switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_one;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (ui_one)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_fboConfigs[] =
	{
		{ "fbo",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa2",	SURFACETYPE_UNORM_FBO,				2 },
		{ "fbo_msaa4",	SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",	SURFACETYPE_FLOAT_FBO,				0 },
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} s_hints[] =
	{
		{ "fastest",	GL_FASTEST	},
		{ "nicest",		GL_NICEST	},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_hintFboConfigs[] =
	{
		{ "default",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa4",		SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",		SURFACETYPE_FLOAT_FBO,				0 }
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
		deUint32		hint;
	} s_textureConfigs[] =
	{
		{ "basic",			SURFACETYPE_DEFAULT_FRAMEBUFFER,	0,	GL_DONT_CARE	},
		{ "msaa4",			SURFACETYPE_UNORM_FBO,				4,	GL_DONT_CARE	},
		{ "float_fastest",	SURFACETYPE_FLOAT_FBO,				0,	GL_FASTEST		},
		{ "float_nicest",	SURFACETYPE_FLOAT_FBO,				0,	GL_NICEST		},
	};

	// .dfdx, .dfdy, .fwidth
	for (int funcNdx = 0; funcNdx < DERIVATE_LAST; funcNdx++)
	{
		const DerivateFunc			function		= DerivateFunc(funcNdx);
		tcu::TestCaseGroup* const	functionGroup	= new tcu::TestCaseGroup(m_testCtx, getDerivateFuncCaseName(function), getDerivateFuncName(function));
		addChild(functionGroup);

		// .constant - no precision variants, checks that derivate of constant arguments is 0
		{
			tcu::TestCaseGroup* const constantGroup = new tcu::TestCaseGroup(m_testCtx, "constant", "Derivate of constant argument");
			functionGroup->addChild(constantGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				const glu::DataType dataType = vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
				constantGroup->addChild(new ConstantDerivateCase(m_context, glu::getDataTypeName(dataType), "", function, dataType));
			}
		}

		// Cases based on LinearDerivateCase
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_linearDerivateCases); caseNdx++)
		{
			tcu::TestCaseGroup* const linearCaseGroup	= new tcu::TestCaseGroup(m_testCtx, s_linearDerivateCases[caseNdx].name, s_linearDerivateCases[caseNdx].description);
			const char*			source					= s_linearDerivateCases[caseNdx].source;
			functionGroup->addChild(linearCaseGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const SurfaceType		surfaceType		= SURFACETYPE_DEFAULT_FRAMEBUFFER;
					const int				numSamples		= 0;
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (caseNdx != 0 && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to default FB.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					linearCaseGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// Fbo cases
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_fboConfigs); caseNdx++)
		{
			tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_fboConfigs[caseNdx].name, "Derivate usage when rendering into FBO");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const SurfaceType			surfaceType		= s_fboConfigs[caseNdx].surfaceType;
			const int					numSamples		= s_fboConfigs[caseNdx].numSamples;
			functionGroup->addChild(fboGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// .fastest, .nicest
		for (int hintCaseNdx = 0; hintCaseNdx < DE_LENGTH_OF_ARRAY(s_hints); hintCaseNdx++)
		{
			tcu::TestCaseGroup* const	hintGroup		= new tcu::TestCaseGroup(m_testCtx, s_hints[hintCaseNdx].name, "Shader derivate hints");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const deUint32				hint			= s_hints[hintCaseNdx].hint;
			functionGroup->addChild(hintGroup);

			for (int fboCaseNdx = 0; fboCaseNdx < DE_LENGTH_OF_ARRAY(s_hintFboConfigs); fboCaseNdx++)
			{
				tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_hintFboConfigs[fboCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_hintFboConfigs[fboCaseNdx].surfaceType;
				const int					numSamples		= s_hintFboConfigs[fboCaseNdx].numSamples;
				hintGroup->addChild(fboGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
					}
				}
			}
		}

		// .texture
		{
			tcu::TestCaseGroup* const textureGroup = new tcu::TestCaseGroup(m_testCtx, "texture", "Derivate of texture lookup result");
			functionGroup->addChild(textureGroup);

			for (int texCaseNdx = 0; texCaseNdx < DE_LENGTH_OF_ARRAY(s_textureConfigs); texCaseNdx++)
			{
				tcu::TestCaseGroup*	const	caseGroup		= new tcu::TestCaseGroup(m_testCtx, s_textureConfigs[texCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_textureConfigs[texCaseNdx].surfaceType;
				const int					numSamples		= s_textureConfigs[texCaseNdx].numSamples;
				const deUint32				hint			= s_textureConfigs[texCaseNdx].hint;
				textureGroup->addChild(caseGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						caseGroup->addChild(new TextureDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples));
					}
				}
			}
		}
	}
}